

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

int testKNNValidatorWrongNumberOfLabels(void)

{
  bool bVar1;
  TypeUnion TVar2;
  StringVector *pSVar3;
  ostream *poVar4;
  Result res;
  Model m1;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Model local_40;
  
  CoreML::Specification::Model::Model(&local_40);
  CoreML::KNNValidatorTests::generateInterface(&local_40);
  if (local_40._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_40);
    local_40._oneof_case_[0] = 0x194;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar2.knearestneighborsclassifier_);
    local_40.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_40.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (local_40.Type_.knearestneighborsclassifier_,3,true);
  CoreML::KNNValidatorTests::addDataPoints(TVar2.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(TVar2.knearestneighborsclassifier_);
  if ((TVar2.glmregressor_)->postevaluationtransform_ != 100) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_ClassLabels
              (TVar2.knearestneighborsclassifier_);
    (TVar2.glmregressor_)->postevaluationtransform_ = 100;
    pSVar3 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(pSVar3);
    ((ClassLabelsUnion *)&((TVar2.pipeline_)->models_).super_RepeatedPtrFieldBase.rep_)->
    stringclasslabels_ = pSVar3;
  }
  pSVar3 = ((ClassLabelsUnion *)&((TVar2.pipeline_)->models_).super_RepeatedPtrFieldBase.rep_)->
           stringclasslabels_;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Idontwork","");
  google::protobuf::internal::RepeatedPtrFieldBase::
  Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(pSVar3->vector_).super_RepeatedPtrFieldBase,(Type *)local_68,
             (enable_if<true,_void> *)0x0);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  CoreML::validate<(MLModelType)404>((Result *)local_68,&local_40);
  bVar1 = CoreML::Result::good((Result *)local_68);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._8_8_ != &local_50) {
    operator_delete((void *)local_68._8_8_,local_50._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_40);
  return (uint)bVar1;
}

Assistant:

int testKNNValidatorWrongNumberOfLabels() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *nnModel = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(nnModel, 3, true);

    KNNValidatorTests::addDataPoints(nnModel);
    KNNValidatorTests::addStringLabels(nnModel);
    nnModel->mutable_stringclasslabels()->add_vector(std::string("Idontwork"));

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}